

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O3

bool next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                index,unsigned_long k,unsigned_long n)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var6
  ;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  
  uVar10 = index._M_current[k - 1];
  if (n <= uVar10) {
    return false;
  }
  if ((ulong)uVar10 < n - 1) {
    index._M_current[k - 1] = uVar10 + 1;
    bVar5 = true;
  }
  else {
    if (k == 1) {
      return false;
    }
    uVar9 = k - 2;
    if (uVar9 != 0) {
      _Var6._M_current = index._M_current + (k - 2);
      do {
        uVar10 = *_Var6._M_current;
        if (uVar10 != _Var6._M_current[1] - 1) goto LAB_0010b1d5;
        _Var6._M_current = _Var6._M_current + -1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    uVar10 = *index._M_current;
    bVar5 = false;
    if (uVar10 != index._M_current[1] - 1) {
      uVar9 = 0;
      _Var6._M_current = index._M_current;
LAB_0010b1d5:
      *_Var6._M_current = uVar10 + 1;
      auVar4 = _DAT_0010e050;
      auVar3 = _DAT_0010e040;
      auVar2 = _DAT_0010e030;
      bVar5 = true;
      if (uVar9 + 1 < k) {
        puVar1 = index._M_current + uVar9;
        lVar7 = k + ~uVar9 + -1;
        uVar10 = *puVar1;
        iVar11 = uVar10 + 1;
        iVar12 = uVar10 + 2;
        iVar13 = uVar10 + 3;
        auVar14._8_4_ = (int)lVar7;
        auVar14._0_8_ = lVar7;
        auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar8 = 0;
        auVar14 = auVar14 ^ _DAT_0010e050;
        do {
          auVar17._8_4_ = (int)uVar8;
          auVar17._0_8_ = uVar8;
          auVar17._12_4_ = (int)(uVar8 >> 0x20);
          auVar16 = (auVar17 | auVar3) ^ auVar4;
          iVar15 = auVar14._4_4_;
          if ((bool)(~(auVar16._4_4_ == iVar15 && auVar14._0_4_ < auVar16._0_4_ ||
                      iVar15 < auVar16._4_4_) & 1)) {
            puVar1[uVar8 + 1] = uVar10 + 1;
          }
          if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
              auVar16._12_4_ <= auVar14._12_4_) {
            puVar1[uVar8 + 2] = iVar11 + 1;
          }
          auVar16 = (auVar17 | auVar2) ^ auVar4;
          iVar18 = auVar16._4_4_;
          if (iVar18 <= iVar15 && (iVar18 != iVar15 || auVar16._0_4_ <= auVar14._0_4_)) {
            puVar1[uVar8 + 3] = iVar12 + 1;
            puVar1[uVar8 + 4] = iVar13 + 1;
          }
          uVar8 = uVar8 + 4;
          uVar10 = uVar10 + 4;
          iVar11 = iVar11 + 4;
          iVar12 = iVar12 + 4;
          iVar13 = iVar13 + 4;
        } while ((~uVar9 + k + 3 & 0xfffffffffffffffc) != uVar8);
      }
    }
  }
  return bVar5;
}

Assistant:

bool next_combination(RandomAccessIterator index, uint k, uint n) {
    auto &last = index[k-1];
    if (last >= n) return false;
    if (last < n - 1) {
        ++last;
        return true;
    }
    if (k == 1) return false;
    uint i = k - 2;
    while (i > 0 && index[i] == index[i+1] - 1) --i;
    if (i == 0 && index[i] == index[i+1] - 1) return false;
    ++index[i];
    while (++i < k) {
        index[i] = index[i-1] + 1;
    }
    return true;
}